

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_layout.cc
# Opt level: O0

vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_> *
upb::generator::FieldNumberOrder
          (vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_> *__return_storage_ptr__,
          MessageDefPtr message)

{
  int iVar1;
  int iVar2;
  iterator iVar3;
  iterator iVar4;
  value_type local_38;
  int local_30;
  int i;
  undefined1 local_19;
  MessageDefPtr local_18;
  MessageDefPtr message_local;
  vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_> *fields;
  
  local_19 = 0;
  local_18.ptr_ = message.ptr_;
  message_local.ptr_ = (upb_MessageDef *)__return_storage_ptr__;
  std::vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>::vector(__return_storage_ptr__);
  iVar1 = MessageDefPtr::field_count(&local_18);
  std::vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>::reserve
            (__return_storage_ptr__,(long)iVar1);
  for (local_30 = 0; iVar1 = local_30, iVar2 = MessageDefPtr::field_count(&local_18), iVar1 < iVar2;
      local_30 = local_30 + 1) {
    local_38.ptr_ = (upb_FieldDef *)MessageDefPtr::field(&local_18,local_30);
    std::vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>::push_back
              (__return_storage_ptr__,&local_38);
  }
  iVar3 = std::vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>::begin
                    (__return_storage_ptr__);
  iVar4 = std::vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>::end
                    (__return_storage_ptr__);
  std::
  sort<__gnu_cxx::__normal_iterator<upb::FieldDefPtr*,std::vector<upb::FieldDefPtr,std::allocator<upb::FieldDefPtr>>>,upb::generator::FieldNumberOrder(upb::MessageDefPtr)::__0>
            (iVar3._M_current,iVar4._M_current);
  return __return_storage_ptr__;
}

Assistant:

std::vector<upb::FieldDefPtr> FieldNumberOrder(upb::MessageDefPtr message) {
  std::vector<upb::FieldDefPtr> fields;
  fields.reserve(message.field_count());
  for (int i = 0; i < message.field_count(); i++) {
    fields.push_back(message.field(i));
  }
  std::sort(fields.begin(), fields.end(),
            [](upb::FieldDefPtr a, upb::FieldDefPtr b) {
              return a.number() < b.number();
            });
  return fields;
}